

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_FFDHE.c
# Opt level: O1

void ffdhe_precomp_p(Spec_FFDHE_ffdhe_alg a,uint64_t *p_r2_n)

{
  int iVar1;
  uint32_t uVar2;
  long lVar3;
  long lVar4;
  uint64_t *puVar5;
  uint8_t *in_RCX;
  uint8_t *extraout_RDX;
  ulong *extraout_RDX_00;
  uint64_t *b_n;
  ulong *puVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint uVar10;
  undefined7 in_register_00000039;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  void *__s;
  uint uVar14;
  uint8_t *os;
  uint8_t *b;
  uint64_t *res;
  ulong uVar15;
  undefined8 uStack_d0;
  uint64_t *puStack_c8;
  code *pcStack_98;
  uint64_t uStack_90;
  uint8_t *puStack_88;
  uint64_t *puStack_80;
  uint8_t *puStack_78;
  ulong uStack_70;
  code *pcStack_40;
  uint8_t auStack_38 [8];
  
  uVar12 = CONCAT71(in_register_00000039,a);
  if (a < 5) {
    lVar3 = *(long *)(&DAT_001e4bd0 + (uint)a * 8);
    sVar13 = *(size_t *)(&DAT_001e4c20 + (uint)a * 8);
    lVar4 = -(sVar13 + 0xf & 0xfffffffffffffff0);
    b = auStack_38 + lVar4;
    puVar7 = auStack_38 + lVar4 + -8;
    puVar7[0] = 0xdf;
    puVar7[1] = '6';
    puVar7[2] = '\x16';
    puVar7[3] = '\0';
    puVar7[4] = '\0';
    puVar7[5] = '\0';
    puVar7[6] = '\0';
    puVar7[7] = '\0';
    memset(b,0,sVar13);
    lVar11 = (ulong)a * 4;
    iVar1 = *(int *)(&DAT_001e4bf8 + lVar11);
    puVar8 = auStack_38 + lVar4 + -8;
    puVar8[0] = 0xfc;
    puVar8[1] = '6';
    puVar8[2] = '\x16';
    puVar8[3] = '\0';
    puVar8[4] = '\0';
    puVar8[5] = '\0';
    puVar8[6] = '\0';
    puVar8[7] = '\0';
    memcpy(b,&DAT_001e4bf8 + iVar1,sVar13);
    uVar2 = *(uint32_t *)(&DAT_001e4c5c + lVar11);
    puVar9 = auStack_38 + lVar4 + -8;
    builtin_memcpy(auStack_38 + lVar4 + -8,"\x127\x16",4);
    puVar9[4] = '\0';
    puVar9[5] = '\0';
    puVar9[6] = '\0';
    puVar9[7] = '\0';
    Hacl_Bignum_Convert_bn_from_bytes_be_uint64(uVar2,b,p_r2_n);
    Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u64
              (*(uint32_t *)(&DAT_001e4c48 + lVar11),*(uint32_t *)(&DAT_001e4c0c + lVar11),p_r2_n,
               p_r2_n + lVar3 + 1);
    return;
  }
  pcStack_40 = Hacl_FFDHE_ffdhe_secret_to_public_precomp;
  ffdhe_precomp_p_cold_1();
  uVar10 = (uint)uVar12;
  puStack_80 = p_r2_n;
  if ((byte)uVar12 < 5) {
    uStack_70 = uVar12 & 0xff;
    uVar2 = *(uint32_t *)(&DAT_001e4c5c + uStack_70 * 4);
    uVar15 = (ulong)(uVar2 - 1 & 0xfffffff8);
    uVar12 = uVar15 + 0x17 & 0xfffffffffffffff0;
    lVar3 = -uVar12;
    b_n = (uint64_t *)((long)&uStack_90 + lVar3);
    sVar13 = uVar15 + 8;
    puStack_88 = in_RCX;
    puStack_78 = extraout_RDX;
    pcStack_40 = (code *)&stack0xfffffffffffffff8;
    *(undefined8 *)((long)&pcStack_98 + lVar3) = 0x1637ac;
    memset(b_n,0,sVar13);
    *b_n = 2;
    res = (uint64_t *)((long)b_n - uVar12);
    res[-1] = 0x1637c9;
    memset(res,0,sVar13);
    res[-1] = 0x1637d8;
    Hacl_Bignum_Convert_bn_from_bytes_be_uint64(uVar2,puStack_78,res);
    uVar12 = uStack_70;
    puVar5 = puStack_80;
    res[-1] = 0x1637ef;
    ffdhe_compute_exp((Spec_FFDHE_ffdhe_alg)uVar12,puVar5,res,b_n,puStack_88);
    return;
  }
  pcStack_98 = Hacl_Bignum_Convert_bn_from_bytes_be_uint64;
  pcStack_40 = (code *)&stack0xfffffffffffffff8;
  Hacl_FFDHE_ffdhe_secret_to_public_precomp_cold_1();
  uVar14 = uVar10 - 1 & 0xfffffff8;
  uVar15 = (ulong)uVar14;
  uVar12 = (ulong)(uVar14 + 8);
  lVar3 = -(uVar12 + 0xf & 0xfffffffffffffff0);
  __s = (void *)((long)&puStack_c8 + lVar3);
  puStack_c8 = p_r2_n;
  pcStack_98 = (code *)&pcStack_40;
  *(undefined8 *)((long)&uStack_d0 + lVar3) = 0x163846;
  memset(__s,0,uVar12);
  puVar5 = puStack_c8;
  *(undefined8 *)((long)&uStack_d0 + lVar3) = 0x16385b;
  memcpy((void *)((long)__s + (uVar12 - uVar10)),puVar5,(ulong)uVar10);
  puVar6 = extraout_RDX_00;
  do {
    uVar12 = *(ulong *)((long)__s + (uVar15 & 0xffffffff));
    *puVar6 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
              (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
              (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 | (uVar12 & 0xff00) << 0x28 |
              uVar12 << 0x38;
    uVar15 = uVar15 - 8;
    puVar6 = puVar6 + 1;
  } while (uVar15 != 0xfffffffffffffff8);
  return;
}

Assistant:

static inline void ffdhe_precomp_p(Spec_FFDHE_ffdhe_alg a, uint64_t *p_r2_n)
{
  uint32_t nLen = (ffdhe_len(a) - 1U) / 8U + 1U;
  uint64_t *p_n = p_r2_n;
  uint64_t *r2_n = p_r2_n + nLen;
  uint32_t sw;
  switch (a)
  {
    case Spec_FFDHE_FFDHE2048:
      {
        sw = 256U;
        break;
      }
    case Spec_FFDHE_FFDHE3072:
      {
        sw = 384U;
        break;
      }
    case Spec_FFDHE_FFDHE4096:
      {
        sw = 512U;
        break;
      }
    case Spec_FFDHE_FFDHE6144:
      {
        sw = 768U;
        break;
      }
    case Spec_FFDHE_FFDHE8192:
      {
        sw = 1024U;
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
  KRML_CHECK_SIZE(sizeof (uint8_t), sw);
  uint8_t p_s[sw];
  memset(p_s, 0U, sw * sizeof (uint8_t));
  const uint8_t *p;
  switch (a)
  {
    case Spec_FFDHE_FFDHE2048:
      {
        p = Hacl_Impl_FFDHE_Constants_ffdhe_p2048;
        break;
      }
    case Spec_FFDHE_FFDHE3072:
      {
        p = Hacl_Impl_FFDHE_Constants_ffdhe_p3072;
        break;
      }
    case Spec_FFDHE_FFDHE4096:
      {
        p = Hacl_Impl_FFDHE_Constants_ffdhe_p4096;
        break;
      }
    case Spec_FFDHE_FFDHE6144:
      {
        p = Hacl_Impl_FFDHE_Constants_ffdhe_p6144;
        break;
      }
    case Spec_FFDHE_FFDHE8192:
      {
        p = Hacl_Impl_FFDHE_Constants_ffdhe_p8192;
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
  uint32_t len = ffdhe_len(a);
  for (uint32_t i = 0U; i < len; i++)
  {
    uint8_t *os = p_s;
    uint8_t x = p[i];
    os[i] = x;
  }
  Hacl_Bignum_Convert_bn_from_bytes_be_uint64(ffdhe_len(a), p_s, p_n);
  Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u64((ffdhe_len(a) - 1U) / 8U + 1U,
    8U * ffdhe_len(a) - 1U,
    p_n,
    r2_n);
}